

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestRunNode::~TestRunNode(TestRunNode *this)

{
  TestRunNode *in_RDI;
  
  ~TestRunNode(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

TestRunNode::~TestRunNode() {}